

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall
soplex::SVSetBase<double>::updateUnusedMemEstimation(SVSetBase<double> *this,int change)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  *(int *)(in_RDI + 0x58) = in_ESI + *(int *)(in_RDI + 0x58);
  *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + 1;
  if (-1 < *(int *)(in_RDI + 0x58)) {
    in_stack_ffffffffffffffe4 = *(int *)(in_RDI + 0x58);
    iVar1 = memSize((SVSetBase<double> *)0x266721);
    if ((in_stack_ffffffffffffffe4 <= iVar1) && (*(int *)(in_RDI + 0x5c) < 1000000)) {
      return;
    }
  }
  countUnusedMem((SVSetBase<double> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  return;
}

Assistant:

void updateUnusedMemEstimation(int change)
   {
      unusedMem += change;
      numUnusedMemUpdates++;

      if(unusedMem < 0 || unusedMem > memSize() || numUnusedMemUpdates >= 1000000)
         countUnusedMem();
   }